

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTAudioEngine_Stop(FACTAudioEngine *pEngine,uint16_t nCategory,uint32_t dwFlags)

{
  uint8_t uVar1;
  int in_EDX;
  uint16_t in_SI;
  FACTAudioEngine *in_RDI;
  LinkedList *list;
  FACTCue *backup;
  FACTCue *cue;
  FACTCue *in_stack_00000028;
  FACTCue *pCue;
  FACTCue *local_18;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x1132d6);
  for (pCue = (FACTCue *)in_RDI->sbList; pCue != (FACTCue *)0x0; pCue = pCue->next) {
    local_18 = pCue->parentBank->cueList;
    while (local_18 != (FACTCue *)0x0) {
      if ((local_18->playingSound == (FACTSoundInstance *)0x0) ||
         (uVar1 = FACT_INTERNAL_IsInCategory(in_RDI,in_SI,local_18->playingSound->sound->category),
         uVar1 == '\0')) {
        local_18 = local_18->next;
      }
      else if ((in_EDX == 1) && (local_18->managed != '\0')) {
        local_18 = local_18->next;
        FACTCue_Destroy(in_stack_00000028);
      }
      else {
        FACTCue_Stop(pCue,0);
        local_18 = local_18->next;
      }
    }
  }
  FAudio_PlatformUnlockMutex((FAudioMutex)0x1133d0);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_Stop(
	FACTAudioEngine *pEngine,
	uint16_t nCategory,
	uint32_t dwFlags
) {
	FACTCue *cue, *backup;
	LinkedList *list;

	FAudio_PlatformLockMutex(pEngine->apiLock);
	list = pEngine->sbList;
	while (list != NULL)
	{
		cue = ((FACTSoundBank*) list->entry)->cueList;
		while (cue != NULL)
		{
			if (	cue->playingSound != NULL &&
				FACT_INTERNAL_IsInCategory(
					pEngine,
					nCategory,
					cue->playingSound->sound->category
				)	)
			{
				if (	dwFlags == FACT_FLAG_STOP_IMMEDIATE &&
					cue->managed	)
				{
					/* Just blow this up now */
					backup = cue->next;
					FACTCue_Destroy(cue);
					cue = backup;
				}
				else
				{
					/* If managed, the mixer will destroy for us */
					FACTCue_Stop(cue, dwFlags);
					cue = cue->next;
				}
			}
			else
			{
				cue = cue->next;
			}
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}